

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall
CAssignStm::CAssignStm(CAssignStm *this,CIdExp *leftExpression,IExpression *rightExpression)

{
  CIdExp *pCVar1;
  IExpression *pIVar2;
  pointer *__ptr;
  PositionInfo PVar3;
  
  (this->super_IStatement).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00180618;
  (this->leftExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = (CIdExp *)0x0;
  (this->rightExpression)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>
  ._M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  PVar3 = PositionInfo::operator+
                    (&(leftExpression->super_IExpression).super_PositionedNode.position,
                     &(rightExpression->super_PositionedNode).position);
  (this->super_IStatement).super_PositionedNode.position = PVar3;
  pCVar1 = (this->leftExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
           _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (this->leftExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = leftExpression;
  if (pCVar1 != (CIdExp *)0x0) {
    (**(code **)(*(long *)&(pCVar1->super_IExpression).super_PositionedNode + 0x10))();
  }
  pIVar2 = (this->rightExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (this->rightExpression)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>
  ._M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = rightExpression;
  if (pIVar2 != (IExpression *)0x0) {
    (**(code **)(*(long *)&(pIVar2->super_PositionedNode).super_INode + 0x10))();
    return;
  }
  return;
}

Assistant:

CAssignStm::CAssignStm(
	CIdExp* leftExpression,
	IExpression* rightExpression
) {
	this->position = leftExpression->position + rightExpression->position;
	this->leftExpression = std::unique_ptr<CIdExp>(leftExpression);
	this->rightExpression = std::unique_ptr<IExpression>(rightExpression);
}